

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall cmLocalUnixMakefileGenerator3::Generate(cmLocalUnixMakefileGenerator3 *this)

{
  cmMakefile *pcVar1;
  cmGlobalUnixMakefileGenerator3 *this_00;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *this_01;
  cmake *this_02;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *this_03;
  __uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
  *p_Var4;
  cmMakefileTargetGenerator *__p;
  pointer pcVar5;
  unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> local_d0;
  unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_> tg;
  cmGeneratorTarget *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__range1;
  cmGlobalUnixMakefileGenerator3 *gg;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *targets;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  cmLocalUnixMakefileGenerator3 *local_10;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_10 = this;
  this_01 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  this_02 = cmGlobalGenerator::GetCMakeInstance(this_01);
  bVar2 = cmake::GetIsInTryCompile(this_02);
  if (!bVar2) {
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"CMAKE_COLOR_MAKEFILE",&local_31);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
    this->ColorMakefile = bVar2;
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_SKIP_PREPROCESSED_SOURCE_RULES",&local_69);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_68);
  this->SkipPreprocessedSourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"CMAKE_SKIP_ASSEMBLY_SOURCE_RULES",
             (allocator<char> *)((long)&targets + 7));
  bVar2 = cmMakefile::IsOn(pcVar1,&local_90);
  this->SkipAssemblySourceRules = bVar2;
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&targets + 7));
  this_03 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  this_00 = (cmGlobalUnixMakefileGenerator3 *)
            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  __end1 = std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin(this_03);
  target = (cmGeneratorTarget *)
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end(this_03);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                                     *)&target), bVar2) {
    p_Var4 = (__uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
              *)__gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&__end1);
    tg._M_t.
    super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
    .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl =
         *(__uniq_ptr_data<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>,_true,_true>
           *)&p_Var4->_M_t;
    TVar3 = cmGeneratorTarget::GetType
                      ((cmGeneratorTarget *)
                       tg._M_t.
                       super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
                       .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl);
    if (TVar3 != INTERFACE_LIBRARY) {
      __p = cmMakefileTargetGenerator::New
                      ((cmGeneratorTarget *)
                       tg._M_t.
                       super___uniq_ptr_impl<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmMakefileTargetGenerator_*,_std::default_delete<cmMakefileTargetGenerator>_>
                       .super__Head_base<0UL,_cmMakefileTargetGenerator_*,_false>._M_head_impl);
      std::unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>::
      unique_ptr<std::default_delete<cmMakefileTargetGenerator>,void>
                ((unique_ptr<cmMakefileTargetGenerator,std::default_delete<cmMakefileTargetGenerator>>
                  *)&local_d0,__p);
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_d0);
      if (bVar2) {
        pcVar5 = std::
                 unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                 ::operator->(&local_d0);
        (*(pcVar5->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])();
        pcVar5 = std::
                 unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>
                 ::get(&local_d0);
        cmGlobalUnixMakefileGenerator3::RecordTargetProgress(this_00,pcVar5);
      }
      std::unique_ptr<cmMakefileTargetGenerator,_std::default_delete<cmMakefileTargetGenerator>_>::
      ~unique_ptr(&local_d0);
    }
    __gnu_cxx::
    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
    ::operator++(&__end1);
  }
  WriteLocalMakefile(this);
  WriteDirectoryInformationFile(this);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::Generate()
{
  // Record whether some options are enabled to avoid checking many
  // times later.
  if (!this->GetGlobalGenerator()->GetCMakeInstance()->GetIsInTryCompile()) {
    this->ColorMakefile = this->Makefile->IsOn("CMAKE_COLOR_MAKEFILE");
  }
  this->SkipPreprocessedSourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_PREPROCESSED_SOURCE_RULES");
  this->SkipAssemblySourceRules =
    this->Makefile->IsOn("CMAKE_SKIP_ASSEMBLY_SOURCE_RULES");

  // Generate the rule files for each target.
  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  for (cmGeneratorTarget* target : targets) {
    if (target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::unique_ptr<cmMakefileTargetGenerator> tg(
      cmMakefileTargetGenerator::New(target));
    if (tg) {
      tg->WriteRuleFiles();
      gg->RecordTargetProgress(tg.get());
    }
  }

  // write the local Makefile
  this->WriteLocalMakefile();

  // Write the cmake file with information for this directory.
  this->WriteDirectoryInformationFile();
}